

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<int>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<int_const>>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<int>_> *params,
          StringPtr *params_1,Delimited<kj::ArrayPtr<const_int>_> *params_2)

{
  size_t sVar1;
  unsigned_long num;
  size_t sVar2;
  size_t sVar3;
  char *target;
  
  sVar2 = Delimited<kj::ArrayPtr<int>_>::size((Delimited<kj::ArrayPtr<int>_> *)this);
  sVar1 = (params->array).size_;
  sVar3 = Delimited<kj::ArrayPtr<const_int>_>::size((Delimited<kj::ArrayPtr<const_int>_> *)params_1)
  ;
  heapString(__return_storage_ptr__,(sVar3 + sVar2 + sVar1) - 1);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<int>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<int_const>>>
            (target,(Delimited<kj::ArrayPtr<int>_> *)this,(StringPtr *)params,
             (Delimited<kj::ArrayPtr<const_int>_> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}